

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall calculator::Token::Token(Token *this,char c)

{
  long lVar1;
  undefined1 local_317;
  undefined1 local_316;
  undefined1 local_315;
  Tag local_314 [17];
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  this->_vptr_Token = (_func_int **)&PTR__Token_00116550;
  local_314[0x10] = 3;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_2d0,local_314 + 0x10,(char (*) [2])"&");
  local_314[0xf] = 4;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_2a8,local_314 + 0xf,(char (*) [2])"|");
  local_314[0xe] = 5;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>
            (&local_280,local_314 + 0xe,(char (*) [2])0x10edf5);
  local_314[0xd] = 6;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_258,local_314 + 0xd,(char (*) [2])"^");
  local_314[0xc] = 7;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_230,local_314 + 0xc,(char (*) [2])"~");
  local_314[0xb] = 9;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_208,local_314 + 0xb,(char (*) [2])"+");
  local_314[10] = 10;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_1e0,local_314 + 10,(char (*) [2])0x10ed92)
  ;
  local_314[9] = 0xb;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_1b8,local_314 + 9,(char (*) [2])0x10e6d4);
  local_314[8] = 0xc;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_190,local_314 + 8,(char (*) [2])"/");
  local_314[7] = 8;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_168,local_314 + 7,(char (*) [2])"=");
  local_314[6] = 0xd;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_140,local_314 + 6,(char (*) [2])"%");
  local_314[5] = 0xe;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(&local_118,local_314 + 5,(char (*) [3])"<<");
  local_314[4] = 0xf;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(&local_f0,local_314 + 4,(char (*) [3])">>");
  local_314[3] = 0x10;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(&local_c8,local_314 + 3,(char (*) [3])"**");
  local_314[2] = 0x13;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_a0,local_314 + 2,(char (*) [2])0x10e8d4);
  local_314[1] = 0x16;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_78,local_314 + 1,(char (*) [2])"(");
  local_314[0] = END_BRACKET;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(&local_50,local_314,(char (*) [2])0x10ea4c);
  std::
  _Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<calculator::Tag_const,std::__cxx11::string>const*>
            ((_Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->tagTable,&local_2d0,&stack0xffffffffffffffd8,0,&local_315,&local_316,
             &local_317);
  lVar1 = 0x288;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2d0.first + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  this->__tag = Other;
  this->__c = c;
  return;
}

Assistant:

Token(char c) : __tag(Tag::Other), __c(c) {}